

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_add_16_er_pd(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint addr_in;
  uint uVar5;
  ulong uVar6;
  
  uVar3 = m68ki_cpu.ir;
  addr_in = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] - 2;
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = addr_in;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar6 = (ulong)(uVar3 >> 7 & 0x1c);
  uVar4 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
  uVar2 = *(uint *)((long)m68ki_cpu.dar + uVar6);
  uVar5 = uVar2 & 0xffff;
  uVar1 = uVar5 + uVar4;
  m68ki_cpu.x_flag = uVar1 >> 8;
  m68ki_cpu.v_flag = ((uVar5 ^ uVar1) & (uVar4 ^ uVar1)) >> 8;
  m68ki_cpu.not_z_flag = uVar1 & 0xffff;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *(uint *)((long)m68ki_cpu.dar + uVar6) = uVar2 & 0xffff0000 | m68ki_cpu.not_z_flag;
  return;
}

Assistant:

static void m68k_op_add_16_er_pd(void)
{
	uint* r_dst = &DX;
	uint src = OPER_AY_PD_16();
	uint dst = MASK_OUT_ABOVE_16(*r_dst);
	uint res = src + dst;

	FLAG_N = NFLAG_16(res);
	FLAG_V = VFLAG_ADD_16(src, dst, res);
	FLAG_X = FLAG_C = CFLAG_16(res);
	FLAG_Z = MASK_OUT_ABOVE_16(res);

	*r_dst = MASK_OUT_BELOW_16(*r_dst) | FLAG_Z;
}